

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O0

void __thiscall
pstore::
error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
::
error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>
          (error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
           *this,descriptor<pstore::details::posix_descriptor_traits> *param_2,
          maybe<unsigned_char,_void> *param_3)

{
  storage_type *this_00;
  maybe<unsigned_char,_void> *args_local_1;
  descriptor<pstore::details::posix_descriptor_traits> *args_local;
  error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>_>
  *this_local;
  
  this[0x10] = (error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
                )0x0;
  this_00 = error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>_>
            ::get_storage((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>_>
                           *)this);
  std::
  tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>
  ::
  tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>,_true>
            (this_00,param_2,param_3);
  return;
}

Assistant:

explicit error_or (in_place_t const inp, Args &&... args)
                : has_error_{false} {
            (void) inp;
            new (get_storage ()) storage_type (std::forward<Args> (args)...);
        }